

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O3

MPP_RET hal_h265e_v580_start(void *hal,HalEncTask *enc_task)

{
  undefined1 *puVar1;
  byte *pbVar2;
  undefined8 uVar3;
  MppDevRegOffCfgs *pMVar4;
  MppDev ctx;
  HalEncTask *pHVar5;
  H265eSyntax_new *pHVar6;
  MppFrameFormat MVar7;
  RK_U32 RVar8;
  MPP_RET MVar9;
  anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu aVar10;
  anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv aVar11;
  anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl aVar12;
  int iVar13;
  RK_U32 RVar14;
  hevc_vepu580_base *__dest;
  void *pvVar15;
  size_t sVar16;
  long lVar17;
  ushort uVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  MppBuffer *ppvVar25;
  MppDevRegWrCfg cfg;
  hevc_vepu580_base *local_d0;
  undefined8 local_c8;
  HalEncTask *local_c0;
  hevc_vepu580_base *local_b8;
  H265eSyntax_new *local_b0;
  int local_a4;
  MppBuffer *local_a0;
  void *local_98;
  long local_90;
  ulong local_88;
  void *local_80;
  undefined8 local_78;
  MppBuffer *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint *local_40;
  ulong local_38;
  
  lVar24 = *(long *)((long)hal + 0x80);
  local_b0 = *(H265eSyntax_new **)((long)hal + 0xd0);
  uVar20 = ((local_b0->pp).num_tile_rows_minus1 + 1) * ((local_b0->pp).num_tile_columns_minus1 + 1);
  local_40 = *(uint **)((long)hal + 0x110);
  local_c0 = enc_task;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xb46);
  }
  *(uint *)((long)hal + 0xe8) = uVar20;
  if ((local_c0->flags).err == 0) {
    if (uVar20 < 5) {
      local_68 = lVar24 + 0x1b0;
      local_70 = &local_c0->output;
      local_a0 = (MppBuffer *)((long)hal + 0xf8);
      local_50 = (ulong)(uVar20 - 1);
      local_58 = (ulong)uVar20;
      uVar22 = 0;
      uVar21 = 0;
      local_a4 = 0;
      local_90 = lVar24;
      local_48 = (ulong)uVar20;
      do {
        __dest = *(hevc_vepu580_base **)(lVar24 + 0x18 + uVar22 * 8);
        pvVar15 = *(void **)(lVar24 + 0x38 + uVar22 * 8);
        if (__dest == (hevc_vepu580_base *)0x0) {
          __dest = (hevc_vepu580_base *)mpp_osal_malloc("hal_h265e_v580_start",0x1d08);
          *(hevc_vepu580_base **)(lVar24 + 0x18 + uVar22 * 8) = __dest;
        }
        if (pvVar15 == (void *)0x0) {
          pvVar15 = mpp_osal_malloc("hal_h265e_v580_start",0x2d4);
          *(void **)(lVar24 + 0x38 + uVar22 * 8) = pvVar15;
        }
        local_98 = pvVar15;
        if (uVar22 == 0) {
          RVar8 = 0;
        }
        else {
          memcpy(__dest,*(void **)(lVar24 + 0x18),0x1d08);
          RVar8 = (RK_U32)uVar22;
        }
        pHVar6 = local_b0;
        local_b8 = (hevc_vepu580_base *)__dest->reserved184_191;
        local_88 = uVar21;
        vepu580_h265_set_me_ram(local_b0,local_b8,RVar8,(RK_S32)uVar21);
        pHVar5 = local_c0;
        pMVar4 = *(MppDevRegOffCfgs **)(lVar24 + 0x218);
        uVar20 = *local_40;
        MVar7 = mpp_frame_get_fmt(local_c0->frame);
        uVar18 = (pHVar6->pp).ver_stride;
        if (uVar18 == 0) {
          uVar18 = (local_b0->pp).pic_height;
        }
        if ((((ulong)pHVar5->rc_task->frm & 8) == 0) && ((MVar7 & 0xf00000) != MPP_FMT_YUV420SP)) {
          RVar8 = mpp_frame_get_fbc_offset(pHVar5->frame);
LAB_00253c46:
          uVar20 = 0;
        }
        else {
          RVar8 = (uint)uVar18 * (uint)(pHVar6->pp).hor_stride;
          switch(uVar20) {
          case 0:
          case 1:
          case 2:
          case 8:
          case 9:
          case 10:
            RVar8 = 0;
            goto LAB_00253c46;
          default:
            _mpp_log_l(2,"hal_h265e_v580","unknown color space: %d\n","vepu580_h265_set_patch_info",
                       (ulong)uVar20);
            uVar20 = RVar8 * 5 >> 2;
            break;
          case 4:
          case 6:
          case 0xc:
            uVar20 = RVar8;
            break;
          case 5:
            uVar20 = RVar8 * 3 >> 1;
            break;
          case 7:
            uVar20 = RVar8 * 5 >> 2;
            break;
          case 0xd:
            uVar20 = RVar8 * 2;
          }
        }
        MVar9 = mpp_dev_multi_offset_update(pMVar4,0xa1,RVar8);
        if (MVar9 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar9);
        }
        MVar9 = mpp_dev_multi_offset_update(pMVar4,0xa2,uVar20);
        if (MVar9 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar9);
        }
        lVar24 = local_90;
        if (1 < (uint)local_48) {
          hal_h265e_v580_set_uniform_tile(local_b8,local_b0,(RK_U32)uVar22,(RK_S32)local_88);
        }
        if (uVar22 != 0) {
          aVar10 = (anon_struct_4_4_5bc86bfe_for_reg0200_src_udfu)
                   mpp_buffer_get_fd_with_caller
                             (*(MppBuffer *)(lVar24 + 400 + uVar22 * 8),"hal_h265e_v580_start");
          __dest->reg0200_src_udfu = aVar10;
          aVar11 = (anon_struct_4_4_5bc8e43d_for_reg0201_src_udfv)
                   mpp_buffer_get_fd_with_caller
                             (*(MppBuffer *)(lVar24 + 0x188 + uVar22 * 8),"hal_h265e_v580_start");
          pHVar5 = local_c0;
          __dest->reg0201_src_udfv = aVar11;
          local_38 = uVar22;
          if (*(int *)((long)hal + 0xec) == 0) {
            sVar16 = mpp_packet_get_length(local_c0->packet);
            RVar8 = (int)sVar16 + local_a4;
            aVar12 = (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
                     mpp_buffer_get_fd_with_caller(pHVar5->output,"hal_h265e_v580_start");
            lVar17 = 0x94;
            ppvVar25 = local_70;
          }
          else {
            ppvVar25 = (MppBuffer *)(local_68 + (uVar22 - 1) * 8);
            aVar12 = (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
                     mpp_buffer_get_fd_with_caller(*ppvVar25,"hal_h265e_v580_start");
            __dest->reg0196_enc_rsl = aVar12;
            __dest->reg0197_src_fill = (anon_struct_4_4_c09dc813_for_reg0197_src_fill)aVar12;
            __dest->reg0198_src_fmt = (anon_struct_4_6_4b431ccf_for_reg0198_src_fmt)aVar12;
            RVar8 = 0;
            lVar17 = 0x9c;
          }
          *(anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl *)
           ((long)__dest->reserved184_191 + lVar17 + -0x60) = aVar12;
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar24 + 0x218),0xaf,RVar8);
          pMVar4 = *(MppDevRegOffCfgs **)(lVar24 + 0x218);
          sVar16 = mpp_buffer_get_size_with_caller(*ppvVar25,"hal_h265e_v580_start");
          mpp_dev_multi_offset_update(pMVar4,0xac,(RK_U32)sVar16);
          RVar8 = *(RK_U32 *)((long)hal + 0x138);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar24 + 0x218),0xa6,RVar8);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar24 + 0x218),0xa4,RVar8);
          uVar22 = local_38;
        }
        ppvVar25 = local_a0;
        if (((ulong)local_c0->rc_task->frm & 4) != 0) {
          RVar8 = (local_b0->pp).field_22.CodingSettingPicturePropertyFlags;
          local_60 = *(long *)((long)hal + 0x80);
          uVar23 = *(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3fU & 0xffffffc0;
          uVar20 = *(int *)(*(long *)((long)hal + 200) + 0x10) + 0xfU & 0xfffffff0;
          if ((*(long *)((long)hal + 0xf8) == 0) &&
             (iVar13 = uVar20 * uVar23,
             mpp_buffer_get_with_tag
                       ((MppBufferGroup)0x0,local_a0,(long)((iVar13 >> 1) + iVar13),"hal_h265e_v580"
                        ,"vepu580_h265e_save_pass1_patch"), *ppvVar25 == (MppBuffer)0x0)) {
            _mpp_log_l(2,"hal_h265e_v580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
          }
          else {
            *(byte *)&__dest->reg0216_sli_splt = *(byte *)&__dest->reg0216_sli_splt | 4;
            RVar14 = mpp_buffer_get_fd_with_caller(*local_a0,"vepu580_h265e_save_pass1_patch");
            __dest->reserved184_191[3] = RVar14;
            __dest->reserved184_191[4] = RVar14;
            puVar1 = &(__dest->reg0216_sli_splt).field_0x3;
            *puVar1 = *puVar1 | 0x80;
            if ((char)RVar8 < '\0') {
              pbVar2 = (byte *)((long)&__dest[1].reg0168_cmvr_addr + 2);
              *pbVar2 = *pbVar2 & 0xdf;
            }
            mpp_dev_multi_offset_update
                      (*(MppDevRegOffCfgs **)(local_60 + 0x218),0xa4,uVar20 * uVar23);
            *(byte *)&__dest->reg0240_synt_sli1 = *(byte *)&__dest->reg0240_synt_sli1 & 0xfe;
            puVar1 = &(__dest->reg0216_sli_splt).field_0x3;
            *puVar1 = *puVar1 & 0xbf;
          }
        }
        if (((ulong)local_c0->rc_task->frm & 8) != 0) {
          lVar24 = *(long *)((long)hal + 0x80);
          uVar3 = *(undefined8 *)(*(long *)((long)hal + 200) + 0xc);
          uVar23 = (int)uVar3 + 0x3f;
          RVar14 = ((int)((ulong)uVar3 >> 0x20) + 0xfU & 0xfffffff0) * (uVar23 & 0xffffffc0);
          __dest->reg0172_bsbt_addr =
               __dest->reg0172_bsbt_addr & 0xffffff0f |
               (*(uint *)(*(long *)((long)hal + 0x110) + 0x10) & 0xf) << 4;
          __dest->reg0222_me_cach =
               (anon_struct_4_5_b98367b4_for_reg0222_me_cach)
               ((uint)__dest->reg0222_me_cach & 0xffffff40 | 0x98);
          uVar20 = __dest->reserved229_231[1];
          __dest->reserved229_231[0] = uVar23 & 0x1ffc0 | __dest->reserved229_231[0] & 0xfffe0000;
          __dest->reserved229_231[1] = uVar23 & 0xffc0 | uVar20 & 0xffff0000;
          *(ulong *)(__dest->reserved225_227 + 2) =
               *(ulong *)(__dest->reserved225_227 + 2) & 0xc000c000a3ffffff;
          RVar8 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)((long)hal + 0xf8),"vepu580_h265e_use_pass1_patch");
          __dest->reserved184_191[0] = RVar8;
          __dest->reserved184_191[1] = RVar8;
          __dest->reserved184_191[2] = RVar8;
          MVar9 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar24 + 0x218),0xa1,RVar14);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar9);
          }
          MVar9 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar24 + 0x218),0xa2,RVar14);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar9);
          }
        }
        ctx = *(MppDev *)((long)hal + 0x68);
        local_c8 = 0x60;
        local_d0 = __dest;
        MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
        if (MVar9 == MPP_OK) {
          if ((hal_h265e_debug & 0x20) != 0) {
            uVar21 = 0;
            RVar8 = hal_h265e_debug;
            do {
              if ((RVar8 & 0x20) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","ctl reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar21 & 0xffffffff,
                           (ulong)*(uint *)((long)__dest->reserved184_191 + (uVar21 - 0x60)));
                RVar8 = hal_h265e_debug;
              }
              uVar21 = uVar21 + 4;
            } while (uVar21 != 0x60);
          }
          local_d0 = local_b8;
          local_c8 = 0x28000000178;
          MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
          if (MVar9 == MPP_OK) {
            if ((hal_h265e_debug & 0x10) != 0) {
              uVar21 = 0;
              RVar8 = hal_h265e_debug;
              do {
                if ((RVar8 & 0x10) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","hw add cfg reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar21 & 0xffffffff,
                             (ulong)*(uint *)((long)local_b8->reserved184_191 + (uVar21 - 0x60)));
                  RVar8 = hal_h265e_debug;
                }
                uVar21 = uVar21 + 4;
              } while (uVar21 != 0x80);
              uVar21 = 0;
              do {
                if ((RVar8 & 0x10) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar21 & 0xffffffff,
                             (ulong)*(uint *)((long)__dest->reserved207_211 + uVar21 + 0x24));
                  RVar8 = hal_h265e_debug;
                }
                uVar21 = uVar21 + 4;
              } while (uVar21 != 0xf8);
            }
            local_c8 = 0x1000000000e4;
            local_d0 = (hevc_vepu580_base *)__dest[1].reserved184_191;
            MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
            local_b8 = (hevc_vepu580_base *)CONCAT44(local_b8._4_4_,MVar9);
            if ((hal_h265e_debug & 0x40) != 0) {
              uVar21 = 0;
              RVar8 = hal_h265e_debug;
              do {
                if ((RVar8 & 0x40) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar21 & 0xffffffff,
                             (ulong)*(uint *)((long)__dest[1].reserved184_191 + uVar21));
                  RVar8 = hal_h265e_debug;
                }
                uVar21 = uVar21 + 4;
              } while (uVar21 != 0xe4);
            }
            if ((MPP_RET)local_b8 == MPP_OK) {
              local_c8 = 0x1700000005d8;
              local_d0 = (hevc_vepu580_base *)&__dest[1].reg0241_synt_sli2;
              MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
              if (MVar9 == MPP_OK) {
                if ((char)hal_h265e_debug < '\0') {
                  uVar21 = 0;
                  RVar8 = hal_h265e_debug;
                  do {
                    if ((char)RVar8 < '\0') {
                      _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                                 uVar21 & 0xffffffff,
                                 (ulong)*(uint *)((long)&__dest[1].reg0241_synt_sli2 + 0x60 +
                                                 (uVar21 - 0x60)));
                      RVar8 = hal_h265e_debug;
                    }
                    uVar21 = uVar21 + 4;
                  } while (uVar21 != 0x5d8);
                }
                local_d0 = (hevc_vepu580_base *)&__dest[5].reg0239_synt_sli0;
                local_c8 = 0x200000000c9c;
                MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
                if (MVar9 == MPP_OK) {
                  local_d0 = (hevc_vepu580_base *)&__dest[0xe].reg0200_src_udfu;
                  local_c8 = 0x300000000480;
                  MVar9 = mpp_dev_ioctl(ctx,4,&local_d0);
                  pvVar15 = local_98;
                  if (MVar9 != MPP_OK) goto LAB_0025409d;
                  local_80 = local_98;
                  local_78 = 0x2c00000004;
                  MVar9 = mpp_dev_ioctl(ctx,5,&local_80);
                  if (MVar9 != MPP_OK) {
                    pcVar19 = "set register read failed %d\n";
                    goto LAB_00254149;
                  }
                  local_80 = (void *)((long)pvVar15 + 4);
                  local_78 = 0x4000000002d0;
                  MVar9 = mpp_dev_ioctl(ctx,5,&local_80);
                  if (MVar9 == MPP_OK) goto LAB_002543a0;
                  pcVar19 = "set register read failed %d\n";
                  goto LAB_002540ac;
                }
              }
              pcVar19 = "set register write failed %d\n";
            }
            else {
              pcVar19 = "set rc kult  write failed %d\n";
              MVar9 = (MPP_RET)local_b8;
            }
            _mpp_log_l(2,"hal_h265e_v580",pcVar19,"hal_h265e_v580_send_regs",(ulong)(uint)MVar9);
          }
          else {
            pcVar19 = "set register write failed %d\n";
LAB_00254149:
            _mpp_log_l(2,"hal_h265e_v580",pcVar19,"hal_h265e_v580_send_regs",(ulong)(uint)MVar9);
          }
        }
        else {
LAB_0025409d:
          pcVar19 = "set register write failed %d\n";
LAB_002540ac:
          _mpp_log_l(2,"hal_h265e_v580",pcVar19,"hal_h265e_v580_send_regs",(ulong)(uint)MVar9);
        }
LAB_002543a0:
        lVar24 = local_90;
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),7,*(void **)(local_90 + 0x218));
        uVar21 = local_88;
        if (uVar22 < local_50) {
          if (*(int *)((long)hal + 0xec) == 0) {
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
            pvVar15 = local_98;
            if (MVar9 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar9);
            }
            iVar13 = *(int *)((long)pvVar15 + 4);
            *(int *)(lVar24 + 0x5c) = *(int *)(lVar24 + 0x5c) + *(int *)((long)pvVar15 + 0x10);
            *(int *)(lVar24 + 0x60) = *(int *)(lVar24 + 0x60) + iVar13;
            *(long *)(lVar24 + 0x68) =
                 *(long *)(lVar24 + 0x68) +
                 (ulong)(*(int *)((long)pvVar15 + 0xc) << 0x10 |
                        *(uint *)((long)pvVar15 + 8) >> 0x10);
            *(int *)(lVar24 + 0x164) = *(int *)(lVar24 + 0x164) + *(int *)((long)pvVar15 + 300);
            *(int *)(lVar24 + 0x160) = *(int *)(lVar24 + 0x160) + *(int *)((long)pvVar15 + 0x124);
            local_a4 = local_a4 + iVar13;
            *(int *)(lVar24 + 0x188) =
                 *(int *)(lVar24 + 0x188) + (*(uint *)((long)pvVar15 + 0x130) & 0x7fffff);
            *(int *)(lVar24 + 0x18c) =
                 *(int *)(lVar24 + 0x18c) + (*(uint *)((long)pvVar15 + 0x128) & 0x1fffff);
          }
          else {
            mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),2,(void *)0x0);
          }
        }
        uVar21 = (ulong)((int)uVar21 + (local_b0->pp).column_width_minus1[uVar22] + 1);
        uVar22 = uVar22 + 1;
        if (uVar22 == local_58) {
          MVar9 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
          if (MVar9 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                       (ulong)(uint)MVar9);
          }
          if ((hal_h265e_debug & 4) == 0) {
            return MVar9;
          }
          _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xbb9);
          return MVar9;
        }
      } while( true );
    }
    _mpp_log_l(4,"hal_h265e_v580","tile_num big then support %d, max %d",(char *)0x0,(ulong)uVar20,4
              );
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return e arly","hal_h265e_v580_start");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET hal_h265e_v580_start(void *hal, HalEncTask *enc_task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    H265eSyntax_new *syn = ctx->syn;
    RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
    RK_U32 stream_len = 0;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    Vepu580H265eFrmCfg *frm = ctx->frm;
    RK_U32 k = 0;
    MPP_RET ret = MPP_OK;
    RK_S32 tile_start_x = 0;

    hal_h265e_enter();

    ctx->tile_num = tile_num;

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return e arly",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    if (tile_num > MAX_TILE_NUM) {
        mpp_log("tile_num big then support %d, max %d", tile_num, MAX_TILE_NUM);
        return MPP_NOK;
    }

    for (k = 0; k < tile_num; k++) {
        H265eV580RegSet *hw_regs = frm->regs_set[k];
        hevc_vepu580_base *reg_base = NULL;
        H265eV580StatusElem *reg_out = frm->regs_ret[k];

        if (!hw_regs) {
            hw_regs = mpp_malloc(H265eV580RegSet, 1);
            frm->regs_set[k] = hw_regs;
        }
        if (!reg_out) {
            reg_out = mpp_malloc(H265eV580StatusElem, 1);
            frm->regs_ret[k] = reg_out;
        }

        reg_base = &hw_regs->reg_base;

        if (k)
            memcpy(hw_regs, frm->regs_set[0], sizeof(*hw_regs));

        vepu580_h265_set_me_ram(syn, reg_base, k, tile_start_x);

        /* set input info */
        vepu580_h265_set_patch_info(frm->reg_cfg, syn, (Vepu541Fmt)fmt->format, enc_task);
        if (tile_num > 1)
            hal_h265e_v580_set_uniform_tile(reg_base, syn, k, tile_start_x);

        if (k) {
            RK_U32 offset = 0;

            reg_base->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k]);
            reg_base->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k - 1]);

            if (!ctx->tile_parall_en) {
                offset = mpp_packet_get_length(enc_task->packet);
                offset += stream_len;

                reg_base->reg0173_bsbb_addr = mpp_buffer_get_fd(enc_task->output);

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, offset);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));
            } else {
                reg_base->reg0172_bsbt_addr = mpp_buffer_get_fd(frm->hw_tile_stream[k - 1]);
                /* TODO: stream size relative with syntax */
                reg_base->reg0173_bsbb_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0174_bsbr_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0175_adr_bsbs  = reg_base->reg0172_bsbt_addr;

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, 0);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(frm->hw_tile_stream[k - 1]));
            }

            offset = ctx->fbc_header_len;

            mpp_dev_multi_offset_update(frm->reg_cfg, 166, offset);
            mpp_dev_multi_offset_update(frm->reg_cfg, 164, offset);
        }

        if (enc_task->rc_task->frm.save_pass1)
            vepu580_h265e_save_pass1_patch(hw_regs, ctx, syn->pp.tiles_enabled_flag);

        if (enc_task->rc_task->frm.use_pass1)
            vepu580_h265e_use_pass1_patch(hw_regs, ctx);

        hal_h265e_v580_send_regs(ctx->dev, hw_regs, reg_out);

        mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, frm->reg_cfg);

        if (k < tile_num - 1) {
            if (!ctx->tile_parall_en) {
                Vepu580H265Fbk *fb = &frm->feedback;

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
                if (ret) {
                    mpp_err_f("send cmd failed %d\n", ret);
                }

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
                if (ret) {
                    mpp_err_f("poll cmd failed %d\n", ret);
                    ret = MPP_ERR_VPUHW;
                }
                stream_len += reg_out->st.bs_lgth_l32;
                fb->qp_sum += reg_out->st.qp_sum;
                fb->out_strm_size += reg_out->st.bs_lgth_l32;
                fb->sse_sum += (RK_S64)(reg_out->st.sse_h32 << 16) +
                               (reg_out->st.st_sse_bsl.sse_l16 & 0xffff);
                fb->st_madi += reg_out->st.madi;
                fb->st_madp += reg_out->st.madp;
                fb->st_mb_num += reg_out->st.st_bnum_b16.num_b16;
                fb->st_ctu_num += reg_out->st.st_bnum_cme.num_ctu;
            } else
                mpp_dev_ioctl(ctx->dev, MPP_DEV_DELIMIT, NULL);
        }
        tile_start_x += (syn->pp.column_width_minus1[k] + 1);
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_h265e_leave();
    return ret;
}